

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udatamem.cpp
# Opt level: O1

void UDataMemory_setData_63(UDataMemory *This,void *dataAddr)

{
  if ((dataAddr != (void *)0x0) &&
     ((*(char *)((long)dataAddr + 2) != -0x26 || (*(char *)((long)dataAddr + 3) != '\'')))) {
    dataAddr = (void *)((long)dataAddr + 8);
  }
  This->pHeader = (DataHeader *)dataAddr;
  return;
}

Assistant:

U_CFUNC const DataHeader *
UDataMemory_normalizeDataPointer(const void *p) {
    /* allow the data to be optionally prepended with an alignment-forcing double value */
    const DataHeader *pdh = (const DataHeader *)p;
    if(pdh==NULL || (pdh->dataHeader.magic1==0xda && pdh->dataHeader.magic2==0x27)) {
        return pdh;
    } else {
#if U_PLATFORM == U_PF_OS400
        /*
        TODO: Fix this once the compiler implements this feature. Keep in sync with genccode.c

        This is here because this platform can't currently put
        const data into the read-only pages of an object or
        shared library (service program). Only strings are allowed in read-only
        pages, so we use char * strings to store the data.

        In order to prevent the beginning of the data from ever matching the
        magic numbers we must skip the initial double.
        [grhoten 4/24/2003]
        */
        return (const DataHeader *)*((const void **)p+1);
#else
        return (const DataHeader *)((const double *)p+1);
#endif
    }
}